

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapped_membank.h
# Opt level: O0

uint8_t __thiscall
n_e_s::core::MappedMemBank<(unsigned_short)8192,_(unsigned_short)16383,_(unsigned_short)8>::
read_byte(MappedMemBank<(unsigned_short)8192,_(unsigned_short)16383,_(unsigned_short)8> *this,
         uint16_t addr)

{
  uchar uVar1;
  uint16_t addr_local;
  MappedMemBank<(unsigned_short)8192,_(unsigned_short)16383,_(unsigned_short)8> *this_local;
  
  uVar1 = std::function<unsigned_char_(unsigned_short)>::operator()(&this->reader_,addr);
  return uVar1;
}

Assistant:

uint8_t read_byte(uint16_t addr) const override {
        return reader_(addr);
    }